

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

string * __thiscall
Jupiter::Socket::resolveHostname_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,addrinfo *addr)

{
  size_t sVar1;
  char resolved [1025];
  char local_418 [1032];
  
  getnameinfo((sockaddr *)this[1].m_data,*(socklen_t *)&this[1]._vptr_Socket,local_418,0x401,
              (char *)0x0,0,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_418,local_418 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveHostname(addrinfo *addr) { // static
	char resolved[NI_MAXHOST];
	getnameinfo(addr->ai_addr, addr->ai_addrlen, resolved, sizeof(resolved), 0, 0, 0);
	return resolved;
}